

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void train_one(problem *prob,parameter *param,double *w,double Cp,double Cn)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  int i;
  uint uVar4;
  long lVar5;
  double *pdVar6;
  l2r_l2_svr_fun *this;
  l2r_l2_svc_fun *this_00;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  int t_1;
  int *piVar15;
  int iVar16;
  long lVar17;
  int i_7;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int *piVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  void *pvVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  double dVar30;
  undefined4 uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  int iStack_1c0;
  double local_1b8;
  double local_198;
  undefined1 local_168 [16];
  undefined4 local_118;
  undefined4 uStack_114;
  double local_108;
  double local_f0 [2];
  void *local_e0;
  double local_d8;
  void *local_c8;
  undefined8 uStack_c0;
  void *local_b8;
  double local_b0;
  feature_node *x_space;
  int local_a0;
  int local_9c;
  TRON tron_obj;
  
  dVar38 = param->eps;
  uVar19 = prob->l;
  lVar5 = (long)(int)uVar19;
  uVar20 = 0;
  uVar25 = 0;
  if (0 < (int)uVar19) {
    uVar25 = (ulong)uVar19;
  }
  iVar23 = 0;
  for (; uVar25 != uVar20; uVar20 = uVar20 + 1) {
    iVar23 = iVar23 + (uint)(0.0 < prob->y[uVar20]);
  }
  iVar16 = uVar19 - iVar23;
  if (iVar23 < (int)(uVar19 - iVar23)) {
    iVar16 = iVar23;
  }
  iVar23 = 1;
  if (1 < iVar16) {
    iVar23 = iVar16;
  }
  if (0xd < (uint)param->solver_type) {
switchD_00105ec0_caseD_4:
    fwrite("ERROR: unknown solver_type\n",0x1b,1,_stderr);
    return;
  }
  dVar32 = *(double *)(&DAT_0010b0d0 + (ulong)(param->init_sol == (double *)0x0) * 8);
  dVar34 = ((double)iVar23 * dVar38) / (double)(int)uVar19;
  uVar20 = 0xffffffffffffffff;
  switch(param->solver_type) {
  case 0:
    uVar27 = lVar5 << 3;
    if ((int)uVar19 < 0) {
      uVar27 = uVar20;
    }
    local_d8 = Cp;
    pdVar6 = (double *)operator_new__(uVar27);
    for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      uVar27 = -(ulong)(0.0 < prob->y[uVar20]);
      pdVar6[uVar20] = (double)(~uVar27 & (ulong)Cn | uVar27 & (ulong)local_d8);
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x30);
    l2r_lr_fun::l2r_lr_fun((l2r_lr_fun *)this_00,prob,pdVar6);
    TRON::TRON(&tron_obj,(function *)this_00,dVar34,dVar32,1000);
    TRON::set_print_string(&tron_obj,liblinear_print_string);
    TRON::tron(&tron_obj,w);
    break;
  case 1:
    iStack_1c0 = 1;
    goto LAB_00106971;
  case 2:
    uVar27 = lVar5 << 3;
    if ((int)uVar19 < 0) {
      uVar27 = uVar20;
    }
    local_d8 = Cp;
    pdVar6 = (double *)operator_new__(uVar27);
    for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      uVar27 = -(ulong)(0.0 < prob->y[uVar20]);
      pdVar6[uVar20] = (double)(~uVar27 & (ulong)Cn | uVar27 & (ulong)local_d8);
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x40);
    l2r_l2_svc_fun::l2r_l2_svc_fun(this_00,prob,pdVar6);
    TRON::TRON(&tron_obj,(function *)this_00,dVar34,dVar32,1000);
    TRON::set_print_string(&tron_obj,liblinear_print_string);
    TRON::tron(&tron_obj,w);
    break;
  case 3:
    iStack_1c0 = 3;
LAB_00106971:
    solve_l2r_l1l2_svc(prob,w,dVar38,Cp,Cn,iStack_1c0);
    return;
  default:
    goto switchD_00105ec0_caseD_4;
  case 5:
    x_space = (feature_node *)0x0;
    local_d8 = Cp;
    transpose(prob,&x_space,(problem *)&tron_obj);
    local_198 = (double)(long)(int)tron_obj.eps._0_4_;
    lVar5 = (long)(int)tron_obj.eps._4_4_;
    uVar25 = lVar5 * 4;
    if (lVar5 < 0) {
      uVar25 = uVar20;
    }
    uVar27 = lVar5 * 8;
    if (lVar5 < 0) {
      uVar27 = uVar20;
    }
    pvVar7 = operator_new__(uVar25);
    pvVar8 = operator_new__((ulong)local_198);
    uVar25 = (long)local_198 * 8;
    if ((long)local_198 < 0) {
      uVar25 = uVar20;
    }
    pvVar9 = operator_new__(uVar25);
    pvVar10 = operator_new__(uVar27);
    local_f0[0] = 0.0;
    local_f0[1] = local_d8;
    uVar20 = 0;
    uVar25 = 0;
    if (0 < (int)tron_obj.eps._4_4_) {
      uVar25 = (ulong)tron_obj.eps._4_4_;
    }
    for (; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      w[uVar20] = 0.0;
    }
    uVar20 = 0;
    uVar27 = 0;
    if (0 < (int)tron_obj.eps._0_4_) {
      uVar27 = (ulong)tron_obj.eps._0_4_;
    }
    for (; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      *(undefined8 *)((long)pvVar9 + uVar20 * 8) = 0x3ff0000000000000;
      *(byte *)((long)pvVar8 + uVar20) =
           -(*(double *)((long)tron_obj.eps_cg + uVar20 * 8) <= 0.0) | 1;
    }
    for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
      *(undefined8 *)((long)pvVar10 + uVar20 * 8) = 0;
      *(int *)((long)pvVar7 + uVar20 * 4) = (int)uVar20;
      dVar38 = 0.0;
      for (piVar15 = *(int **)(tron_obj._16_8_ + uVar20 * 8); lVar5 = (long)*piVar15, lVar5 != -1;
          piVar15 = piVar15 + 4) {
        cVar1 = *(char *)((long)pvVar8 + lVar5 + -1);
        dVar32 = (double)(int)cVar1 * *(double *)(piVar15 + 2);
        *(double *)(piVar15 + 2) = dVar32;
        *(double *)((long)pvVar9 + lVar5 * 8 + -8) =
             *(double *)((long)pvVar9 + lVar5 * 8 + -8) - w[uVar20] * dVar32;
        dVar38 = dVar38 + local_f0[cVar1] * dVar32 * dVar32;
        *(double *)((long)pvVar10 + uVar20 * 8) = dVar38;
      }
    }
    dVar38 = -1.0;
    local_118 = 0;
    uStack_114 = 0x7ff00000;
    uVar24 = 0;
    uVar19 = tron_obj.eps._4_4_;
    while (uVar24 != 1000) {
      uVar20 = 0;
      if (0 < (int)uVar19) {
        uVar20 = (ulong)uVar19;
      }
      uVar4 = uVar19;
      for (uVar28 = 0; uVar20 != uVar28; uVar28 = uVar28 + 1) {
        iVar23 = rand();
        lVar5 = (long)(iVar23 % (int)uVar4) + uVar28;
        uVar37 = *(undefined4 *)((long)pvVar7 + lVar5 * 4);
        *(undefined4 *)((long)pvVar7 + lVar5 * 4) = *(undefined4 *)((long)pvVar7 + uVar28 * 4);
        *(undefined4 *)((long)pvVar7 + uVar28 * 4) = uVar37;
        uVar4 = uVar4 - 1;
      }
      dVar32 = (double)CONCAT44(uStack_114,local_118);
      local_c8 = (void *)(-dVar32 / (double)(int)tron_obj.eps._0_4_);
      uStack_c0 = 0x8000000000000000;
      iVar23 = 0;
      dVar30 = 0.0;
      local_118 = 0;
      uStack_114 = 0;
LAB_001061f8:
      if (iVar23 < (int)uVar19) {
        iVar16 = *(int *)((long)pvVar7 + (long)iVar23 * 4);
        lVar5 = (long)iVar16;
        piVar15 = *(int **)(tron_obj._16_8_ + lVar5 * 8);
        dVar44 = 0.0;
        dVar33 = 0.0;
        for (pdVar6 = (double *)(piVar15 + 2); lVar17 = (long)*(int *)(pdVar6 + -1), lVar17 != -1;
            pdVar6 = pdVar6 + 2) {
          dVar39 = *(double *)((long)pvVar9 + lVar17 * 8 + -8);
          if (0.0 < dVar39) {
            dVar40 = local_f0[*(char *)((long)pvVar8 + lVar17 + -1)] * *pdVar6;
            dVar44 = dVar44 + *pdVar6 * dVar40;
            dVar33 = dVar33 + dVar39 * -dVar40;
          }
        }
        dVar33 = dVar33 + dVar33;
        dVar44 = dVar44 + dVar44;
        if (dVar44 <= 1e-12) {
          dVar44 = 1e-12;
        }
        dVar43 = dVar33 + 1.0;
        dVar40 = dVar33 + -1.0;
        dVar39 = w[lVar5];
        if ((dVar39 != 0.0) || (NAN(dVar39))) {
          dVar41 = dVar40;
          if (0.0 < dVar39) {
            dVar41 = dVar43;
          }
          dVar41 = ABS(dVar41);
LAB_0010630c:
          if (dVar44 * dVar39 <= dVar43) {
            if (dVar40 <= dVar44 * dVar39) {
              dVar44 = -dVar39;
            }
            else {
              dVar44 = -dVar40 / dVar44;
            }
          }
          else {
            dVar44 = -dVar43 / dVar44;
          }
          if ((double)CONCAT44(uStack_114,local_118) <= dVar41) {
            local_118 = SUB84(dVar41,0);
            uStack_114 = (undefined4)((ulong)dVar41 >> 0x20);
          }
          dVar30 = dVar30 + dVar41;
          if (1e-12 <= ABS(dVar44)) {
            dVar41 = dVar33 * dVar44 + (ABS(dVar39 + dVar44) - ABS(dVar39));
            dVar40 = *(double *)((long)pvVar10 + lVar5 * 8);
            dVar43 = 0.0;
            for (iVar16 = 0; dVar42 = dVar44, iVar16 != 0x14; iVar16 = iVar16 + 1) {
              dVar43 = dVar43 - dVar42;
              dVar44 = dVar41 * -0.01 + (ABS(dVar39 + dVar42) - ABS(dVar39));
              if (dVar40 * dVar42 * dVar42 + dVar33 * dVar42 + dVar44 <= 0.0) goto LAB_00106622;
              dVar45 = 0.0;
              piVar21 = piVar15;
              if (iVar16 == 0) {
                local_198 = 0.0;
                for (; lVar17 = (long)*piVar21, lVar17 != -1; piVar21 = piVar21 + 4) {
                  dVar46 = *(double *)((long)pvVar9 + lVar17 * 8 + -8);
                  if (0.0 < dVar46) {
                    local_198 = local_198 +
                                local_f0[*(char *)((long)pvVar8 + lVar17 + -1)] * dVar46 * dVar46;
                  }
                  dVar46 = *(double *)(piVar21 + 2) * dVar43 + dVar46;
                  *(double *)((long)pvVar9 + lVar17 * 8 + -8) = dVar46;
                  if (0.0 < dVar46) {
                    dVar45 = dVar45 + local_f0[*(char *)((long)pvVar8 + lVar17 + -1)] * dVar46 *
                                      dVar46;
                  }
                }
              }
              else {
                for (; lVar17 = (long)*piVar21, lVar17 != -1; piVar21 = piVar21 + 4) {
                  dVar46 = *(double *)(piVar21 + 2) * dVar43 +
                           *(double *)((long)pvVar9 + lVar17 * 8 + -8);
                  *(double *)((long)pvVar9 + lVar17 * 8 + -8) = dVar46;
                  if (0.0 < dVar46) {
                    dVar45 = dVar45 + local_f0[*(char *)((long)pvVar8 + lVar17 + -1)] * dVar46 *
                                      dVar46;
                  }
                }
              }
              if ((dVar44 + dVar45) - local_198 <= 0.0) goto LAB_00106657;
              dVar41 = dVar41 * 0.5;
              dVar44 = dVar42 * 0.5;
              dVar43 = dVar42;
            }
            w[lVar5] = dVar39 + dVar42;
            info("#");
            for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
              *(undefined8 *)((long)pvVar9 + uVar20 * 8) = 0x3ff0000000000000;
            }
            for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
              dVar44 = w[uVar20];
              if ((dVar44 != 0.0) || (NAN(dVar44))) {
                for (piVar15 = *(int **)(tron_obj._16_8_ + uVar20 * 8); lVar5 = (long)*piVar15,
                    lVar5 != -1; piVar15 = piVar15 + 4) {
                  *(double *)((long)pvVar9 + lVar5 * 8 + -8) =
                       *(double *)(piVar15 + 2) * -dVar44 +
                       *(double *)((long)pvVar9 + lVar5 * 8 + -8);
                }
              }
            }
          }
        }
        else {
          if (dVar43 < 0.0) {
            dVar41 = -dVar43;
            goto LAB_0010630c;
          }
          dVar41 = dVar40;
          if (((0.0 < dVar40) || (dVar41 = 0.0, dVar43 <= dVar32 / (double)(int)tron_obj.eps._0_4_))
             || ((double)local_c8 <= dVar40)) goto LAB_0010630c;
          lVar5 = (long)(int)uVar19;
          uVar19 = uVar19 - 1;
          *(undefined4 *)((long)pvVar7 + (long)iVar23 * 4) =
               *(undefined4 *)((long)pvVar7 + lVar5 * 4 + -4);
          *(int *)((long)pvVar7 + lVar5 * 4 + -4) = iVar16;
          iVar23 = iVar23 + -1;
        }
        goto LAB_0010665d;
      }
      dVar32 = dVar30;
      if (uVar24 != 0) {
        dVar32 = dVar38;
      }
      dVar38 = dVar32;
      uVar24 = uVar24 + 1;
      if (uVar24 % 10 == 0) {
        info(".");
      }
      if (dVar30 <= dVar34 * dVar38) {
        if (uVar19 == tron_obj.eps._4_4_) goto LAB_001077a7;
        info("*");
        local_118 = 0;
        uStack_114 = 0x7ff00000;
        uVar19 = tron_obj.eps._4_4_;
      }
    }
    uVar24 = 1000;
LAB_001077a7:
    info("\noptimization finished, #iter = %d\n");
    if (999 < (int)uVar24) {
      info("\nWARNING: reaching max number of iterations\n");
    }
    dVar38 = 0.0;
    uVar28 = 0;
    for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
      for (piVar15 = *(int **)(tron_obj._16_8_ + uVar20 * 8); (long)*piVar15 != -1;
          piVar15 = piVar15 + 4) {
        *(double *)(piVar15 + 2) =
             *(double *)((long)tron_obj.eps_cg + -8 + (long)*piVar15 * 8) * *(double *)(piVar15 + 2)
        ;
      }
      dVar32 = w[uVar20];
      dVar34 = ABS(dVar32) + dVar38;
      if ((dVar32 == 0.0) && (!NAN(dVar32))) {
        dVar34 = dVar38;
      }
      dVar38 = dVar34;
      uVar28 = (ulong)((int)uVar28 + (uint)(dVar32 != 0.0));
    }
    for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      dVar32 = *(double *)((long)pvVar9 + uVar20 * 8);
      if (0.0 < dVar32) {
        dVar38 = dVar38 + local_f0[*(char *)((long)pvVar8 + uVar20)] * dVar32 * dVar32;
      }
    }
    info("Objective value = %lf\n",dVar38);
    info("#nonzeros/#features = %d/%d\n",uVar28,(ulong)tron_obj.eps._4_4_);
    operator_delete__(pvVar7);
    operator_delete__(pvVar8);
    operator_delete__(pvVar9);
    operator_delete__(pvVar10);
    if (tron_obj.eps_cg != 0.0) {
      operator_delete__((void *)tron_obj.eps_cg);
    }
LAB_001078e7:
    if ((void *)tron_obj._16_8_ != (void *)0x0) {
      operator_delete__((void *)tron_obj._16_8_);
    }
    if (x_space == (feature_node *)0x0) {
      return;
    }
    operator_delete__(x_space);
    return;
  case 6:
    x_space = (feature_node *)0x0;
    local_d8 = Cp;
    transpose(prob,&x_space,(problem *)&tron_obj);
    uVar27 = (ulong)(int)tron_obj.eps._0_4_;
    lVar5 = (long)(int)tron_obj.eps._4_4_;
    uVar25 = lVar5 * 4;
    if (lVar5 < 0) {
      uVar25 = uVar20;
    }
    uVar28 = lVar5 * 8;
    if (lVar5 < 0) {
      uVar28 = uVar20;
    }
    local_c8 = operator_new__(uVar25);
    local_b8 = operator_new__(uVar27);
    pvVar7 = operator_new__(uVar28);
    pvVar8 = operator_new__(uVar28);
    pvVar9 = operator_new__(uVar28);
    pvVar10 = operator_new__(uVar28);
    uVar25 = uVar27 * 8;
    if ((long)uVar27 < 0) {
      uVar25 = uVar20;
    }
    pvVar11 = operator_new__(uVar25);
    pvVar12 = operator_new__(uVar25);
    pvVar13 = operator_new__(uVar25);
    local_e0 = operator_new__(uVar25);
    pvVar14 = operator_new__(uVar25);
    pvVar26 = local_b8;
    local_f0[0] = 0.0;
    local_f0[1] = local_d8;
    uVar20 = 0;
    uVar25 = 0;
    if (0 < (int)tron_obj.eps._4_4_) {
      uVar25 = (ulong)tron_obj.eps._4_4_;
    }
    for (; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      w[uVar20] = 0.0;
    }
    uVar20 = 0;
    uVar27 = 0;
    if (0 < (int)tron_obj.eps._0_4_) {
      uVar27 = (ulong)tron_obj.eps._0_4_;
    }
    for (; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      *(byte *)((long)local_b8 + uVar20) =
           -(*(double *)((long)tron_obj.eps_cg + uVar20 * 8) <= 0.0) | 1;
      *(undefined8 *)((long)pvVar12 + uVar20 * 8) = 0;
    }
    local_108 = 0.0;
    for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
      dVar38 = w[uVar20];
      *(undefined8 *)((long)pvVar10 + uVar20 * 8) = 0;
      *(double *)((long)pvVar9 + uVar20 * 8) = dVar38;
      *(int *)((long)local_c8 + uVar20 * 4) = (int)uVar20;
      dVar32 = 0.0;
      for (piVar15 = *(int **)(tron_obj._16_8_ + uVar20 * 8); lVar17 = (long)*piVar15, lVar17 != -1;
          piVar15 = piVar15 + 4) {
        dVar30 = *(double *)(piVar15 + 2);
        *(double *)((long)pvVar12 + lVar17 * 8 + -8) =
             dVar38 * dVar30 + *(double *)((long)pvVar12 + lVar17 * 8 + -8);
        if (*(char *)((long)local_b8 + lVar17 + -1) == -1) {
          dVar32 = dVar32 + dVar30 * Cn;
          *(double *)((long)pvVar10 + uVar20 * 8) = dVar32;
        }
      }
      local_108 = local_108 + ABS(dVar38);
    }
    for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      dVar30 = exp(*(double *)((long)pvVar12 + uVar20 * 8));
      *(double *)((long)pvVar12 + uVar20 * 8) = dVar30;
      dVar32 = 1.0 / (dVar30 + 1.0);
      dVar38 = local_f0[*(char *)((long)pvVar26 + uVar20)];
      *(double *)((long)local_e0 + uVar20 * 8) = dVar32 * dVar38;
      *(double *)((long)pvVar14 + uVar20 * 8) = dVar30 * dVar38 * dVar32 * dVar32;
    }
    dVar32 = (double)(int)tron_obj.eps._0_4_;
    dVar38 = INFINITY;
    dVar30 = 1.0;
    uVar19 = 0;
    uVar37 = 0;
    uVar31 = 0xbff00000;
LAB_00106cd0:
    pvVar3 = local_c8;
    if (uVar19 != 100) {
      dVar44 = dVar38 / dVar32;
      dVar39 = -dVar38;
      uVar4 = 0;
      dVar33 = 0.0;
      dVar38 = 0.0;
      uVar24 = tron_obj.eps._4_4_;
      do {
LAB_00106d1a:
        if ((int)uVar24 <= (int)uVar4) goto LAB_00106e2e;
        iVar23 = *(int *)((long)local_c8 + (ulong)uVar4 * 4);
        lVar17 = (long)iVar23;
        *(undefined8 *)((long)pvVar7 + lVar17 * 8) = 0x3d719799812dea11;
        dVar40 = 1e-12;
        dVar43 = 0.0;
        for (piVar15 = *(int **)(tron_obj._16_8_ + lVar17 * 8); lVar22 = (long)*piVar15,
            lVar22 != -1; piVar15 = piVar15 + 4) {
          dVar41 = *(double *)(piVar15 + 2);
          dVar40 = dVar40 + *(double *)((long)pvVar14 + lVar22 * 8 + -8) * dVar41 * dVar41;
          dVar43 = dVar43 + *(double *)((long)local_e0 + lVar22 * 8 + -8) * dVar41;
          *(double *)((long)pvVar7 + lVar17 * 8) = dVar40;
        }
        dVar43 = *(double *)((long)pvVar10 + lVar17 * 8) - dVar43;
        *(double *)((long)pvVar8 + lVar17 * 8) = dVar43;
        dVar41 = dVar43 + 1.0;
        dVar43 = dVar43 + -1.0;
        dVar40 = w[lVar17];
        if ((dVar40 == 0.0) && (!NAN(dVar40))) {
          if (dVar41 < 0.0) {
            dVar40 = -dVar41;
            goto LAB_00106e1e;
          }
          dVar40 = dVar43;
          if (((0.0 < dVar43) || (dVar40 = 0.0, dVar41 <= dVar44)) || (dVar39 / dVar32 <= dVar43))
          goto LAB_00106e1e;
          lVar17 = (long)(int)uVar24;
          uVar24 = uVar24 - 1;
          *(undefined4 *)((long)local_c8 + (ulong)uVar4 * 4) =
               *(undefined4 *)((long)local_c8 + lVar17 * 4 + -4);
          *(int *)((long)local_c8 + lVar17 * 4 + -4) = iVar23;
          goto LAB_00106d1a;
        }
        if (dVar40 <= 0.0) {
          dVar40 = ABS(dVar43);
        }
        else {
          dVar40 = ABS(dVar41);
        }
LAB_00106e1e:
        if (dVar38 <= dVar40) {
          dVar38 = dVar40;
        }
        dVar33 = dVar33 + dVar40;
        uVar4 = uVar4 + 1;
      } while( true );
    }
LAB_001075b1:
    info("=========================\n");
    info("optimization finished, #iter = %d\n",(ulong)uVar19);
    if (99 < uVar19) {
      info("WARNING: reaching max number of iterations\n");
    }
    uVar28 = 0;
    dVar38 = 0.0;
    for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      dVar32 = w[uVar20];
      dVar34 = ABS(dVar32) + dVar38;
      if ((dVar32 == 0.0) && (!NAN(dVar32))) {
        dVar34 = dVar38;
      }
      uVar28 = (ulong)((int)uVar28 + (uint)(dVar32 != 0.0));
      dVar38 = dVar34;
    }
    for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      if ((long)*(char *)((long)pvVar26 + uVar20) == 1) {
        dVar32 = 1.0 / *(double *)((long)pvVar12 + uVar20 * 8);
        local_1b8 = local_d8;
      }
      else {
        local_1b8 = local_f0[*(char *)((long)pvVar26 + uVar20)];
        dVar32 = *(double *)((long)pvVar12 + uVar20 * 8);
      }
      dVar32 = log(dVar32 + 1.0);
      dVar38 = dVar38 + dVar32 * local_1b8;
    }
    info("Objective value = %lf\n",dVar38);
    info("#nonzeros/#features = %d/%d\n",uVar28,lVar5);
    operator_delete__(local_c8);
    operator_delete__(pvVar26);
    operator_delete__(pvVar7);
    operator_delete__(pvVar8);
    operator_delete__(pvVar9);
    operator_delete__(pvVar10);
    operator_delete__(pvVar11);
    operator_delete__(pvVar12);
    operator_delete__(pvVar13);
    operator_delete__(local_e0);
    operator_delete__(pvVar14);
    if (tron_obj.eps_cg != 0.0) {
      operator_delete__((void *)tron_obj.eps_cg);
    }
    goto LAB_001078e7;
  case 7:
    solve_l2r_lr_dual(prob,w,dVar38,Cp,Cn);
    return;
  case 0xb:
    uVar27 = lVar5 << 3;
    if ((int)uVar19 < 0) {
      uVar27 = uVar20;
    }
    pdVar6 = (double *)operator_new__(uVar27);
    for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      pdVar6[uVar20] = param->C;
    }
    this = (l2r_l2_svr_fun *)operator_new(0x48);
    l2r_l2_svr_fun::l2r_l2_svr_fun(this,prob,pdVar6,param->p);
    TRON::TRON(&tron_obj,(function *)this,param->eps,0.1,1000);
    TRON::set_print_string(&tron_obj,liblinear_print_string);
    TRON::tron(&tron_obj,w);
    (*(this->super_l2r_l2_svc_fun).super_function._vptr_function[5])(this);
    goto LAB_00106958;
  case 0xc:
    iStack_1c0 = 0xc;
    goto LAB_00107780;
  case 0xd:
    iStack_1c0 = 0xd;
LAB_00107780:
    solve_l2r_l1l2_svr(prob,w,param,iStack_1c0);
    return;
  }
  (*(this_00->super_function)._vptr_function[5])(this_00);
LAB_00106958:
  operator_delete__(pdVar6);
  TRON::~TRON(&tron_obj);
  return;
LAB_00106e2e:
  uVar35 = SUB84(dVar33,0);
  uVar36 = (int)((ulong)dVar33 >> 0x20);
  if (uVar19 != 0) {
    uVar35 = uVar37;
    uVar36 = uVar31;
  }
  if (dVar33 <= dVar34 * (double)CONCAT44(uVar36,uVar35)) goto LAB_001075b1;
  for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
    *(undefined8 *)((long)pvVar11 + uVar20 * 8) = 0;
  }
  local_b0 = dVar30 * (double)CONCAT44(uVar36,uVar35);
  local_198 = INFINITY;
  uVar4 = uVar24;
  iVar23 = 0;
  do {
    iVar16 = iVar23;
    if (iVar16 == 1000) goto LAB_00107161;
    uVar20 = 0;
    if (0 < (int)uVar4) {
      uVar20 = (ulong)uVar4;
    }
    uVar18 = uVar4;
    for (uVar28 = 0; uVar20 != uVar28; uVar28 = uVar28 + 1) {
      iVar23 = rand();
      lVar17 = (long)(iVar23 % (int)uVar18) + uVar28;
      uVar37 = *(undefined4 *)((long)pvVar3 + lVar17 * 4);
      *(undefined4 *)((long)pvVar3 + lVar17 * 4) = *(undefined4 *)((long)pvVar3 + uVar28 * 4);
      *(undefined4 *)((long)pvVar3 + uVar28 * 4) = uVar37;
      uVar18 = uVar18 - 1;
    }
    dVar33 = local_198 / dVar32;
    dVar44 = -local_198;
    dVar39 = 0.0;
    local_198 = 0.0;
    for (iVar23 = 0; iVar23 < (int)uVar4; iVar23 = iVar23 + 1) {
      iVar2 = *(int *)((long)pvVar3 + (long)iVar23 * 4);
      lVar17 = (long)iVar2;
      dVar40 = *(double *)((long)pvVar7 + lVar17 * 8);
      dVar43 = *(double *)((long)pvVar9 + lVar17 * 8);
      dVar41 = (dVar43 - w[lVar17]) * 1e-12 + *(double *)((long)pvVar8 + lVar17 * 8);
      piVar15 = *(int **)(tron_obj._16_8_ + lVar17 * 8);
      for (piVar21 = piVar15; lVar22 = (long)*piVar21, lVar22 != -1; piVar21 = piVar21 + 4) {
        dVar41 = dVar41 + *(double *)(piVar21 + 2) * *(double *)((long)pvVar14 + lVar22 * 8 + -8) *
                          *(double *)((long)pvVar11 + lVar22 * 8 + -8);
      }
      dVar42 = dVar41 + 1.0;
      dVar41 = dVar41 + -1.0;
      if ((dVar43 != 0.0) || (NAN(dVar43))) {
        dVar45 = dVar41;
        if (0.0 < dVar43) {
          dVar45 = dVar42;
        }
        dVar45 = ABS(dVar45);
LAB_00107067:
        if (dVar40 * dVar43 <= dVar42) {
          if (dVar41 <= dVar40 * dVar43) {
            dVar40 = -dVar43;
          }
          else {
            dVar40 = -dVar41 / dVar40;
          }
        }
        else {
          dVar40 = -dVar42 / dVar40;
        }
        if (local_198 <= dVar45) {
          local_198 = dVar45;
        }
        dVar39 = dVar39 + dVar45;
        if (1e-12 <= ABS(dVar40)) {
          if (dVar40 <= -10.0) {
            dVar40 = -10.0;
          }
          if (10.0 <= dVar40) {
            dVar40 = 10.0;
          }
          *(double *)((long)pvVar9 + lVar17 * 8) = dVar43 + dVar40;
          for (; lVar17 = (long)*piVar15, lVar17 != -1; piVar15 = piVar15 + 4) {
            *(double *)((long)pvVar11 + lVar17 * 8 + -8) =
                 *(double *)(piVar15 + 2) * dVar40 + *(double *)((long)pvVar11 + lVar17 * 8 + -8);
          }
        }
      }
      else {
        if (dVar42 < 0.0) {
          dVar45 = -dVar42;
          goto LAB_00107067;
        }
        dVar45 = dVar41;
        if (((0.0 < dVar41) || (dVar45 = 0.0, dVar42 <= dVar33)) || (dVar44 / dVar32 <= dVar41))
        goto LAB_00107067;
        lVar17 = (long)(int)uVar4;
        uVar4 = uVar4 - 1;
        *(undefined4 *)((long)pvVar3 + (long)iVar23 * 4) =
             *(undefined4 *)((long)pvVar3 + lVar17 * 4 + -4);
        *(int *)((long)pvVar3 + lVar17 * 4 + -4) = iVar2;
        iVar23 = iVar23 + -1;
      }
    }
    iVar23 = iVar16 + 1;
  } while ((local_b0 < dVar39) ||
          (local_198 = INFINITY, bVar29 = uVar4 != uVar24, uVar4 = uVar24, bVar29));
  if (iVar16 == 999) goto LAB_00107161;
LAB_0010718c:
  pvVar26 = local_b8;
  local_a0 = iVar23;
  dVar44 = 0.0;
  local_168 = ZEXT816(0);
  for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
    dVar33 = *(double *)((long)pvVar9 + uVar20 * 8);
    uVar37 = local_168._12_4_;
    local_168._8_4_ = local_168._8_4_;
    local_168._0_8_ =
         (double)local_168._0_8_ + (dVar33 - w[uVar20]) * *(double *)((long)pvVar8 + uVar20 * 8);
    local_168._12_4_ = uVar37;
    dVar44 = (double)(~-(ulong)(dVar33 != 0.0) & (ulong)dVar44 |
                     (ulong)(ABS(dVar33) + dVar44) & -(ulong)(dVar33 != 0.0));
  }
  dVar33 = 0.0;
  for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
    if (*(char *)((long)local_b8 + uVar20) == -1) {
      dVar33 = dVar33 + *(double *)((long)pvVar11 + uVar20 * 8) * Cn;
    }
  }
  local_168._0_8_ = (double)local_168._0_8_ + (dVar44 - local_108);
  iVar23 = 0;
LAB_00107257:
  if (iVar23 == 0x14) {
    for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      *(undefined8 *)((long)pvVar12 + uVar20 * 8) = 0;
    }
    for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
      dVar44 = w[uVar20];
      if ((dVar44 != 0.0) || (NAN(dVar44))) {
        for (piVar15 = *(int **)(tron_obj._16_8_ + uVar20 * 8); lVar17 = (long)*piVar15,
            lVar17 != -1; piVar15 = piVar15 + 4) {
          *(double *)((long)pvVar12 + lVar17 * 8 + -8) =
               *(double *)(piVar15 + 2) * dVar44 + *(double *)((long)pvVar12 + lVar17 * 8 + -8);
        }
      }
    }
    for (uVar20 = 0; pvVar26 = local_b8, uVar27 != uVar20; uVar20 = uVar20 + 1) {
      dVar44 = exp(*(double *)((long)pvVar12 + uVar20 * 8));
      *(double *)((long)pvVar12 + uVar20 * 8) = dVar44;
    }
  }
  else {
    local_9c = iVar23;
    local_b0 = dVar33;
    dVar33 = (double)local_168._0_8_ * -0.01 + (dVar44 - local_108) + dVar33;
    for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
      dVar40 = exp(*(double *)((long)pvVar11 + uVar20 * 8));
      dVar43 = *(double *)((long)pvVar12 + uVar20 * 8) * dVar40;
      *(double *)((long)pvVar13 + uVar20 * 8) = dVar43;
      dVar39 = local_f0[*(char *)((long)pvVar26 + uVar20)];
      dVar40 = log((dVar43 + 1.0) / (dVar40 + dVar43));
      dVar33 = dVar33 + dVar40 * dVar39;
    }
    if (0.0 < dVar33) goto code_r0x00107328;
    for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
      w[uVar20] = *(double *)((long)pvVar9 + uVar20 * 8);
    }
    for (uVar20 = 0; local_108 = dVar44, uVar27 != uVar20; uVar20 = uVar20 + 1) {
      dVar33 = *(double *)((long)pvVar13 + uVar20 * 8);
      *(double *)((long)pvVar12 + uVar20 * 8) = dVar33;
      dVar40 = 1.0 / (dVar33 + 1.0);
      dVar39 = local_f0[*(char *)((long)pvVar26 + uVar20)];
      *(double *)((long)local_e0 + uVar20 * 8) = dVar40 * dVar39;
      *(double *)((long)pvVar14 + uVar20 * 8) = dVar33 * dVar39 * dVar40 * dVar40;
    }
  }
  dVar44 = dVar30 * 0.25;
  if (local_a0 != 1) {
    dVar44 = dVar30;
  }
  dVar30 = dVar44;
  uVar19 = uVar19 + 1;
  info("iter %3d  #CD cycles %d\n");
  uVar37 = uVar35;
  uVar31 = uVar36;
  goto LAB_00106cd0;
LAB_00107161:
  info("WARNING: reaching max number of inner iterations\n");
  iVar23 = 1000;
  goto LAB_0010718c;
code_r0x00107328:
  dVar44 = 0.0;
  for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
    dVar33 = (w[uVar20] + *(double *)((long)pvVar9 + uVar20 * 8)) * 0.5;
    *(double *)((long)pvVar9 + uVar20 * 8) = dVar33;
    dVar44 = (double)(~-(ulong)(dVar33 != 0.0) & (ulong)dVar44 |
                     (ulong)(ABS(dVar33) + dVar44) & -(ulong)(dVar33 != 0.0));
  }
  for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
    *(double *)((long)pvVar11 + uVar20 * 8) = *(double *)((long)pvVar11 + uVar20 * 8) * 0.5;
  }
  local_168._0_8_ = (double)local_168._0_8_ * 0.5;
  dVar33 = local_b0 * 0.5;
  iVar23 = local_9c + 1;
  goto LAB_00107257;
LAB_00106622:
  for (; lVar17 = (long)*piVar15, lVar17 != -1; piVar15 = piVar15 + 4) {
    *(double *)((long)pvVar9 + lVar17 * 8 + -8) =
         *(double *)(piVar15 + 2) * dVar43 + *(double *)((long)pvVar9 + lVar17 * 8 + -8);
  }
LAB_00106657:
  w[lVar5] = dVar39 + dVar42;
LAB_0010665d:
  iVar23 = iVar23 + 1;
  goto LAB_001061f8;
}

Assistant:

static void train_one(const problem *prob, const parameter *param, double *w, double Cp, double Cn)
{
	//inner and outer tolerances for TRON
	double eps = param->eps;
	double eps_cg = 0.1;
	if(param->init_sol != NULL)
		eps_cg = 0.5;

	int pos = 0;
	int neg = 0;
	for(int i=0;i<prob->l;i++)
		if(prob->y[i] > 0)
			pos++;
	neg = prob->l - pos;
	double primal_solver_tol = eps*max(min(pos,neg), 1)/prob->l;

	function *fun_obj=NULL;
	switch(param->solver_type)
	{
		case L2R_LR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_lr_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_l2_svc_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L2LOSS_SVC_DUAL);
			break;
		case L2R_L1LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L1LOSS_SVC_DUAL);
			break;
		case L1R_L2LOSS_SVC:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_l2_svc(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L1R_LR:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_lr(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L2R_LR_DUAL:
			solve_l2r_lr_dual(prob, w, eps, Cp, Cn);
			break;
		case L2R_L2LOSS_SVR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
				C[i] = param->C;

			fun_obj=new l2r_l2_svr_fun(prob, C, param->p);
			TRON tron_obj(fun_obj, param->eps);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;

		}
		case L2R_L1LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L1LOSS_SVR_DUAL);
			break;
		case L2R_L2LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L2LOSS_SVR_DUAL);
			break;
		default:
			fprintf(stderr, "ERROR: unknown solver_type\n");
			break;
	}
}